

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_BrDeleteDomain_Test::TestBody
          (InterpreterTestSuite_PC_BrDeleteDomain_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  Registry *pRVar6;
  bool bVar7;
  Status SVar8;
  char *pcVar9;
  Status local_47a;
  Status local_479;
  string local_478;
  string local_458;
  internal local_438 [8];
  pointer local_430;
  string local_428;
  string local_408;
  BorderRouterArray bra;
  undefined1 local_3d0 [16];
  _Alloc_hider local_3c0;
  char local_3b0 [24];
  ByteArray local_398;
  undefined1 local_378 [24];
  string local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [20];
  State local_2fc;
  undefined1 local_2f8 [8];
  UnixTime local_2f0;
  UnixTime local_2e8;
  _Alloc_hider local_2e0;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  bra.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&bra);
  _Var5 = value.mError.mMessage._M_dataplus;
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&bra);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_478,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xb0b,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_478,(Message *)&bra);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_478);
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(bra.
         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
         ._M_impl.super__Vector_impl_data._M_start)->_vptr_BorderRouter[1])();
    }
    local_430 = value.mError.mMessage._M_dataplus._M_p;
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) goto LAB_0019b6e0;
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
  }
  else {
    if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10)
      {
        operator_delete(*value.mError.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var5._M_p);
    }
    pRVar6 = ctx.mRegistry;
    bra.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&bra.
                   super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.1","");
    local_378._0_8_ = (pointer)0x0;
    local_378._8_8_ = (pointer)0x0;
    local_378._16_8_ = (pointer)0x0;
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"1.1","");
    ot::commissioner::BorderAgent::State::State((State *)(local_2f8 + 4),0,0,0,0,0);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"net1","");
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
    local_320._M_allocated_capacity = (size_type)local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
    local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340._M_allocated_capacity = (size_type)local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"domain1","");
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    pcVar9 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"","");
    ot::commissioner::UnixTime::UnixTime((UnixTime *)&local_2e0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)&bra,0x4e21,(ByteArray *)local_378,&local_478,
               (State)local_2f8._4_4_,&local_408,2,&local_458,&local_428,(Timestamp)0x0,0,
               (string *)&local_320,&local_398,(string *)&local_340,'\0',0,&local_360,
               (UnixTime)local_2e0._M_p,0x101f);
    local_479 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&value);
    local_47a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_438,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_479,&local_47a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    if ((undefined1 *)local_340._0_8_ != local_330) {
      operator_delete((void *)local_340._0_8_);
    }
    if (local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_320._M_allocated_capacity != local_310) {
      operator_delete((void *)local_320._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((pointer)local_378._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_378._0_8_);
    }
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&bra.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pcVar4 = local_430;
    if (local_438[0] == (internal)0x0) {
      testing::Message::Message((Message *)&value);
      if (local_430 != (pointer)0x0) {
        pcVar9 = *(char **)local_430;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xb0f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
      if (local_430 == (pointer)0x0) goto LAB_0019b6e0;
      if (*(pointer *)local_430 != local_430 + 0x10) {
        operator_delete(*(pointer *)local_430);
      }
    }
    else {
      if (local_430 != (pointer)0x0) {
        if (*(pointer *)local_430 != local_430 + 0x10) {
          operator_delete(*(pointer *)local_430);
        }
        operator_delete(pcVar4);
      }
      pRVar6 = ctx.mRegistry;
      bra.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&bra.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.2","");
      local_378._0_8_ = (pointer)0x0;
      local_378._8_8_ = (pointer)0x0;
      local_378._16_8_ = (pointer)0x0;
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"1.1","");
      ot::commissioner::BorderAgent::State::State((State *)local_2f8,0,0,0,0,0);
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"net2","");
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
      local_320._M_allocated_capacity = (size_type)local_310;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
      local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_340._M_allocated_capacity = (size_type)local_330;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"domain2","");
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_3b0._16_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360);
      ot::commissioner::UnixTime::UnixTime(&local_2e8,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)&bra,0x4e22,(ByteArray *)local_378,&local_478,
                 (State)local_2f8._0_4_,&local_408,1,&local_458,&local_428,(Timestamp)0x0,0,
                 (string *)&local_320,&local_398,(string *)&local_340,'\0',0,&local_360,local_2e8,
                 0x101f);
      local_479 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&value);
      local_47a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_438,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_479,&local_47a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      if ((undefined1 *)local_340._0_8_ != local_330) {
        operator_delete((void *)local_340._0_8_);
      }
      if (local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_320._M_allocated_capacity != local_310) {
        operator_delete((void *)local_320._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
      if ((pointer)local_378._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_378._0_8_);
      }
      if (bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&bra.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar4 = local_430;
      if (local_438[0] == (internal)0x0) {
        testing::Message::Message((Message *)&value);
        if (local_430 != (pointer)0x0) {
          local_3b0._16_8_ = *(undefined8 *)local_430;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bra,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb13,(char *)local_3b0._16_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
        if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
        }
        if (local_430 == (pointer)0x0) goto LAB_0019b6e0;
        if (*(pointer *)local_430 != local_430 + 0x10) {
          operator_delete(*(pointer *)local_430);
        }
      }
      else {
        if (local_430 != (pointer)0x0) {
          if (*(pointer *)local_430 != local_430 + 0x10) {
            operator_delete(*(pointer *)local_430);
          }
          operator_delete(pcVar4);
        }
        pRVar6 = ctx.mRegistry;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&bra.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.3","");
        local_378._0_8_ = (pointer)0x0;
        local_378._8_8_ = (pointer)0x0;
        local_378._16_8_ = (pointer)0x0;
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"1.1","");
        ot::commissioner::BorderAgent::State::State(&local_2fc,0,0,0,0,0);
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"net1","");
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
        local_320._M_allocated_capacity = (size_type)local_310;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
        local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_340._M_allocated_capacity = (size_type)local_330;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"domain1","");
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        local_3b0._16_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_360);
        ot::commissioner::UnixTime::UnixTime(&local_2f0,0);
        pcVar9 = (char *)(ulong)(uint)local_2fc;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&value,(string *)&bra,0x4e23,(ByteArray *)local_378,&local_478,
                   local_2fc,&local_408,2,&local_458,&local_428,(Timestamp)0x0,0,
                   (string *)&local_320,&local_398,(string *)&local_340,'\0',0,&local_360,local_2f0,
                   0x101f);
        local_479 = ot::commissioner::persistent_storage::Registry::Add
                              (pRVar6,(BorderAgent *)&value);
        local_47a = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  (local_438,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.3\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_479,&local_47a);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        if ((undefined1 *)local_340._0_8_ != local_330) {
          operator_delete((void *)local_340._0_8_);
        }
        if (local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_398.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((undefined1 *)local_320._M_allocated_capacity != local_310) {
          operator_delete((void *)local_320._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        if ((pointer)local_378._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_378._0_8_);
        }
        if (bra.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(bra.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_438[0] != (internal)0x0) {
          if (local_430 != (pointer)0x0) {
            if (*(pointer *)local_430 != local_430 + 0x10) {
              operator_delete(*(pointer *)local_430);
            }
            operator_delete(local_430);
          }
          local_408.field_2._M_allocated_capacity = 0;
          local_408._M_dataplus._M_p = (pointer)0x0;
          local_408._M_string_length = 0;
          paVar1 = &value.mError.mMessage.field_2;
          value.mError.mCode = kNone;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          paVar2 = &value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&bra.
                         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
          value.mData._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&bra,"br delete --dom domain1","");
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&local_458,&ctx.mInterpreter,(string *)&bra);
          local_478.field_2._M_allocated_capacity = local_408.field_2._M_allocated_capacity;
          local_478._M_string_length = local_408._M_string_length;
          local_478._M_dataplus._M_p = local_408._M_dataplus._M_p;
          local_408.field_2._M_allocated_capacity = local_458.field_2._M_allocated_capacity;
          local_408._M_dataplus._M_p = local_458._M_dataplus._M_p;
          local_408._M_string_length = local_458._M_string_length;
          local_458._M_dataplus._M_p = (pointer)0x0;
          local_458._M_string_length = 0;
          local_458.field_2._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_478);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_458);
          if (bra.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(bra.
                            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          ot::commissioner::Interpreter::Eval
                    ((Value *)&bra,&ctx.mInterpreter,(Expression *)&local_408);
          value.mError.mCode =
               (ErrorCode)
               bra.
               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::operator=
                    ((string *)&value.mError.mMessage,
                     (string *)
                     &bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_3c0);
          if (local_3c0._M_p != local_3b0) {
            operator_delete(local_3c0._M_p);
          }
          if (bra.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_3d0) {
            operator_delete(bra.
                            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
          }
          bVar7 = ot::commissioner::Interpreter::Value::HasNoError(&value);
          local_478._M_dataplus._M_p._0_1_ = bVar7;
          local_478._M_string_length = 0;
          if (!bVar7) {
            testing::Message::Message((Message *)&local_458);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&bra,(internal *)&local_478,(AssertionResult *)0x2ddeee,"false",
                       "true",pcVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb1e,(char *)bra.
                                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_428,(Message *)&local_458);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
            if (bra.
                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&bra.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(bra.
                              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((long *)local_458._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_458._M_dataplus._M_p + 8))();
            }
            sVar3 = local_478._M_string_length;
            if ((undefined8 *)local_478._M_string_length != (undefined8 *)0x0) {
              if (*(undefined8 **)local_478._M_string_length !=
                  (undefined8 *)(local_478._M_string_length + 0x10)) {
                operator_delete(*(undefined8 **)local_478._M_string_length);
              }
              operator_delete((void *)sVar3);
            }
          }
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SVar8 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                            (ctx.mRegistry,&bra);
          local_458._M_dataplus._M_p._0_1_ = SVar8;
          local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&local_478,"ctx.mRegistry->GetAllBorderRouters(bra)",
                     "RegistryStatus::kSuccess",(Status *)&local_458,(Status *)&local_428);
          if ((char)local_478._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_458);
            if ((undefined8 *)local_478._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_478._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb20,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_428,(Message *)&local_458);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
            if ((long *)local_458._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_458._M_dataplus._M_p + 8))();
            }
          }
          sVar3 = local_478._M_string_length;
          if ((undefined8 *)local_478._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_478._M_string_length !=
                (undefined8 *)(local_478._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_478._M_string_length);
            }
            operator_delete((void *)sVar3);
          }
          local_458._M_dataplus._M_p =
               (pointer)(((long)bra.
                                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)bra.
                                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x7d6343eb1a1f58d1
                        );
          local_428._M_dataplus._M_p._0_4_ = 1;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)&local_478,"bra.size()","1",(unsigned_long *)&local_458,
                     (int *)&local_428);
          if ((char)local_478._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_458);
            if ((undefined8 *)local_478._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_478._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb21,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_428,(Message *)&local_458);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_458._M_dataplus._M_p + 8))();
            }
          }
          sVar3 = local_478._M_string_length;
          if ((undefined8 *)local_478._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_478._M_string_length !=
                (undefined8 *)(local_478._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_478._M_string_length);
            }
            operator_delete((void *)sVar3);
          }
          std::
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ::~vector(&bra);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mData._M_dataplus._M_p != paVar2) {
            operator_delete(value.mData._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
            operator_delete(value.mError.mMessage._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_408);
          goto LAB_0019b6e0;
        }
        testing::Message::Message((Message *)&value);
        if (local_430 != (pointer)0x0) {
          local_3b0._16_8_ = *(undefined8 *)local_430;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bra,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb17,(char *)local_3b0._16_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
        if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
        }
        if (local_430 == (pointer)0x0) goto LAB_0019b6e0;
        if (*(pointer *)local_430 != local_430 + 0x10) {
          operator_delete(*(pointer *)local_430);
        }
      }
    }
  }
  operator_delete(local_430);
LAB_0019b6e0:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteDomain)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.3", 20003, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete --dom domain1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);
}